

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::pickreturnstack(Forth *this)

{
  uint uVar1;
  uint uVar2;
  
  requireDStackDepth(this,1,"PICKRETURNSTACK");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->returnStack);
  if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
    uVar1 = ForthStack<unsigned_int>::getTop(&this->returnStack,(ulong)(uVar2 - uVar1));
    ForthStack<unsigned_int>::setTop(&this->dStack,uVar1);
    return;
  }
  return;
}

Assistant:

void pickreturnstack(){
			REQUIRE_DSTACK_DEPTH(1, "PICKRETURNSTACK");
			auto localNum = dStack.getTop(); 
			auto localsQty = returnStack.getTop(); 
			if(localNum<localsQty){
			 auto localValue= returnStack.getTop(localsQty-localNum);
			 dStack.setTop(localValue);

			}
		}